

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterCompareText
              (SortSubtask *pTask,int *pbKey2Cached,void *pKey1,int nKey1,void *pKey2,int nKey2)

{
  byte bVar1;
  int iVar2;
  byte *__s1;
  byte *__s2;
  byte *in_RDX;
  long in_RDI;
  byte *in_R8;
  int res;
  int n2;
  int n1;
  u8 *v2;
  u8 *v1;
  u8 *p2;
  u8 *p1;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  uint uVar3;
  u32 *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar4;
  uint uVar5;
  uint local_58;
  uint local_54;
  
  __s1 = in_RDX + *in_RDX;
  __s2 = in_R8 + *in_R8;
  if (in_RDX[1] < 0x80) {
    local_54 = (uint)in_RDX[1];
    uVar5 = 1;
  }
  else {
    bVar1 = sqlite3GetVarint32((uchar *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                                                ),in_stack_ffffffffffffff90);
    uVar5 = (uint)bVar1;
  }
  if (in_R8[1] < 0x80) {
    local_58 = (uint)in_R8[1];
    uVar4 = 1;
  }
  else {
    bVar1 = sqlite3GetVarint32((uchar *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                                                ),in_stack_ffffffffffffff90);
    uVar4 = (uint)bVar1;
  }
  uVar3 = local_58;
  if ((int)local_54 < (int)local_58) {
    uVar3 = local_54;
  }
  iVar2 = memcmp(__s1,__s2,(long)((int)(uVar3 - 0xd) / 2));
  if (iVar2 == 0) {
    iVar2 = local_54 - local_58;
  }
  if (iVar2 == 0) {
    if (1 < *(ushort *)(*(long *)(*(long *)(in_RDI + 0x10) + 0x28) + 6)) {
      iVar2 = vdbeSorterCompareTail
                        ((SortSubtask *)(ulong)uVar5,
                         (int *)CONCAT44(uVar4,in_stack_ffffffffffffff98),__s2,
                         (int)((ulong)__s1 >> 0x20),
                         (void *)CONCAT44(uVar3,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7c
                        );
    }
  }
  else if (**(char **)(*(long *)(*(long *)(in_RDI + 0x10) + 0x28) + 0x18) != '\0') {
    iVar2 = -iVar2;
  }
  return iVar2;
}

Assistant:

static int vdbeSorterCompareText(
  SortSubtask *pTask,             /* Subtask context (for pKeyInfo) */
  int *pbKey2Cached,              /* True if pTask->pUnpacked is pKey2 */
  const void *pKey1, int nKey1,   /* Left side of comparison */
  const void *pKey2, int nKey2    /* Right side of comparison */
){
  const u8 * const p1 = (const u8 * const)pKey1;
  const u8 * const p2 = (const u8 * const)pKey2;
  const u8 * const v1 = &p1[ p1[0] ];   /* Pointer to value 1 */
  const u8 * const v2 = &p2[ p2[0] ];   /* Pointer to value 2 */

  int n1;
  int n2;
  int res;

  getVarint32(&p1[1], n1);
  getVarint32(&p2[1], n2);
  res = memcmp(v1, v2, (MIN(n1, n2) - 13)/2);
  if( res==0 ){
    res = n1 - n2;
  }

  if( res==0 ){
    if( pTask->pSorter->pKeyInfo->nKeyField>1 ){
      res = vdbeSorterCompareTail(
          pTask, pbKey2Cached, pKey1, nKey1, pKey2, nKey2
      );
    }
  }else{
    if( pTask->pSorter->pKeyInfo->aSortOrder[0] ){
      res = res * -1;
    }
  }

  return res;
}